

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O2

void convolve_2d_sr_ver_4tap_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  __m256i *palVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ulong uVar8;
  int16_t *piVar9;
  int16_t *src;
  long lVar10;
  long lVar11;
  undefined1 (*pauVar12) [32];
  int iVar13;
  uint8_t *dst_00;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  __m256i alVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  __m256i r [2];
  __m256i coeffs_256 [2];
  __m256i r1 [4];
  __m256i tt_256 [2] [4];
  __m256i ss_256 [2] [4];
  __m256i r0 [4];
  __m256i local_4a0;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  __m256i local_420;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  __m256i local_3a0;
  undefined1 local_380 [32];
  longlong local_360 [8];
  longlong local_320 [8];
  __m256i local_2e0 [2];
  undefined1 local_2a0 [32];
  __m256i local_260 [2];
  undefined1 local_220 [32];
  __m256i local_1e0 [2];
  undefined1 local_1a0 [32];
  __m256i local_160 [2];
  undefined1 local_120 [32];
  longlong local_e0 [8];
  longlong local_a0 [14];
  
  if (w == 2) {
    uVar8 = (ulong)((uint)filter_params_y->taps * (subpel_y_q4 & 0xfU));
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)im_block;
    auVar14 = vpshufd_avx(auVar23,0x55);
    uVar3 = *(uint *)(im_block + 4);
    auVar14 = vpinsrd_avx(auVar14,*(undefined4 *)(im_block + 4),1);
    uVar2 = *(undefined4 *)(filter_params_y->filter_ptr + uVar8 + 2);
    auVar17._4_4_ = uVar2;
    auVar17._0_4_ = uVar2;
    auVar17._8_4_ = uVar2;
    auVar17._12_4_ = uVar2;
    uVar2 = *(undefined4 *)(filter_params_y->filter_ptr + uVar8 + 4);
    auVar20._4_4_ = uVar2;
    auVar20._0_4_ = uVar2;
    auVar20._8_4_ = uVar2;
    auVar20._12_4_ = uVar2;
    auVar14 = vpunpcklwd_avx(auVar23,auVar14);
    lVar10 = 0;
    auVar27._8_4_ = 0x400;
    auVar27._0_8_ = 0x40000000400;
    auVar27._12_4_ = 0x400;
    do {
      auVar29 = vpmaddwd_avx(auVar14,auVar17);
      auVar14 = vpinsrd_avx(ZEXT416(uVar3),*(undefined4 *)(im_block + lVar10 * 2 + 6),1);
      auVar29 = vpaddd_avx(auVar29,auVar27);
      uVar3 = *(uint *)(im_block + lVar10 * 2 + 8);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(im_block + lVar10 * 2 + 6);
      auVar14 = vpunpcklwd_avx(auVar14,auVar24);
      auVar21 = vpmaddwd_avx(auVar14,auVar20);
      auVar29 = vpaddd_avx(auVar29,auVar21);
      auVar29 = vpsrad_avx(auVar29,0xb);
      auVar29 = vpackssdw_avx(auVar29,auVar29);
      auVar29 = vpackuswb_avx(auVar29,auVar29);
      vpextrw_avx(auVar29,0);
      vpextrw_avx(auVar29,1);
      lVar10 = lVar10 + 2;
    } while (h != (int)lVar10);
  }
  else {
    uVar8 = (ulong)((uint)filter_params_y->taps * (subpel_y_q4 & 0xfU));
    uVar2 = *(undefined4 *)(filter_params_y->filter_ptr + uVar8 + 2);
    alVar30[0]._4_4_ = uVar2;
    alVar30[0]._0_4_ = uVar2;
    alVar30[1]._0_4_ = uVar2;
    alVar30[1]._4_4_ = uVar2;
    alVar30[2]._0_4_ = uVar2;
    alVar30[2]._4_4_ = uVar2;
    alVar30[3]._0_4_ = uVar2;
    alVar30[3]._4_4_ = uVar2;
    uVar2 = *(undefined4 *)(filter_params_y->filter_ptr + uVar8 + 4);
    auVar31._4_4_ = uVar2;
    auVar31._0_4_ = uVar2;
    auVar31._8_4_ = uVar2;
    auVar31._12_4_ = uVar2;
    auVar31._16_4_ = uVar2;
    auVar31._20_4_ = uVar2;
    auVar31._24_4_ = uVar2;
    auVar31._28_4_ = uVar2;
    local_3a0 = alVar30;
    local_380 = auVar31;
    if (w == 0x10) {
      auVar18 = *(undefined1 (*) [32])im_block;
      auVar19 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar22 = *(undefined1 (*) [32])(im_block + 0x20);
      auVar33 = ZEXT3264(auVar22);
      if (subpel_y_q4 == 8) {
        pauVar12 = (undefined1 (*) [32])(im_block + 0x40);
        do {
          auVar32 = auVar33._0_32_;
          auVar31 = pauVar12[-1];
          auVar22 = *pauVar12;
          auVar18 = vpaddw_avx2(auVar31,auVar18);
          auVar26 = vpaddw_avx2(auVar19,auVar32);
          auVar28 = vpunpcklwd_avx2(auVar18,auVar26);
          auVar18 = vpunpckhwd_avx2(auVar18,auVar26);
          local_4a0 = (__m256i)vpmaddwd_avx2(auVar28,(undefined1  [32])alVar30);
          local_480 = vpmaddwd_avx2(auVar18,(undefined1  [32])alVar30);
          auVar18 = vpaddw_avx2(auVar22,auVar19);
          auVar19 = vpaddw_avx2(auVar31,auVar32);
          auVar26 = vpunpcklwd_avx2(auVar18,auVar19);
          auVar18 = vpunpckhwd_avx2(auVar18,auVar19);
          local_460 = vpmaddwd_avx2(auVar26,(undefined1  [32])alVar30);
          local_440 = vpmaddwd_avx2(auVar18,(undefined1  [32])alVar30);
          xy_y_round_store_16x2_avx2(&local_4a0,dst,(long)dst_stride);
          auVar33 = ZEXT3264(auVar22);
          dst = dst + dst_stride * 2;
          pauVar12 = pauVar12 + 2;
          h = h + -2;
          auVar19 = auVar31;
          auVar18 = auVar32;
        } while (h != 0);
      }
      else {
        auVar26 = vpunpcklwd_avx2(auVar18,auVar19);
        auVar18 = vpunpckhwd_avx2(auVar18,auVar19);
        auVar28 = vpunpcklwd_avx2(auVar19,auVar22);
        auVar19 = vpunpckhwd_avx2(auVar19,auVar22);
        pauVar12 = (undefined1 (*) [32])(im_block + 0x40);
        do {
          auVar22 = pauVar12[-1];
          auVar32 = *pauVar12;
          auVar6 = vpunpcklwd_avx2(auVar33._0_32_,auVar22);
          auVar4 = vpunpckhwd_avx2(auVar33._0_32_,auVar22);
          auVar7 = vpunpcklwd_avx2(auVar22,auVar32);
          auVar5 = vpunpckhwd_avx2(auVar22,auVar32);
          auVar22 = vpmaddwd_avx2(auVar26,(undefined1  [32])alVar30);
          auVar26 = vpmaddwd_avx2(auVar6,auVar31);
          local_4a0 = (__m256i)vpaddd_avx2(auVar26,auVar22);
          auVar18 = vpmaddwd_avx2(auVar18,(undefined1  [32])alVar30);
          auVar22 = vpmaddwd_avx2(auVar4,auVar31);
          local_480 = vpaddd_avx2(auVar22,auVar18);
          auVar18 = vpmaddwd_avx2(auVar28,(undefined1  [32])alVar30);
          auVar22 = vpmaddwd_avx2(auVar7,auVar31);
          local_460 = vpaddd_avx2(auVar22,auVar18);
          auVar18 = vpmaddwd_avx2(auVar19,(undefined1  [32])alVar30);
          auVar19 = vpmaddwd_avx2(auVar5,auVar31);
          local_440 = vpaddd_avx2(auVar19,auVar18);
          xy_y_round_store_16x2_avx2(&local_4a0,dst,(long)dst_stride);
          dst = dst + dst_stride * 2;
          pauVar12 = pauVar12 + 2;
          auVar33 = ZEXT3264(auVar32);
          h = h + -2;
          auVar19 = auVar5;
          auVar18 = auVar4;
          auVar28 = auVar7;
          auVar26 = auVar6;
        } while (h != 0);
      }
    }
    else if (w == 8) {
      auVar18 = *(undefined1 (*) [32])im_block;
      auVar19 = *(undefined1 (*) [32])(im_block + 8);
      if (subpel_y_q4 == 8) {
        pauVar12 = (undefined1 (*) [32])(im_block + 0x18);
        do {
          auVar31 = *(undefined1 (*) [32])(pauVar12[-1] + 0x10);
          auVar22 = *pauVar12;
          auVar18 = vpaddw_avx2(auVar22,auVar18);
          auVar19 = vpaddw_avx2(auVar31,auVar19);
          auVar26 = vpunpcklwd_avx2(auVar18,auVar19);
          auVar18 = vpunpckhwd_avx2(auVar18,auVar19);
          local_4a0 = (__m256i)vpmaddwd_avx2(auVar26,(undefined1  [32])alVar30);
          local_480 = vpmaddwd_avx2(auVar18,(undefined1  [32])alVar30);
          xy_y_round_store_8x2_avx2(&local_4a0,dst,(long)dst_stride);
          dst = dst + dst_stride * 2;
          pauVar12 = pauVar12 + 1;
          h = h + -2;
          auVar19 = auVar22;
          auVar18 = auVar31;
        } while (h != 0);
      }
      else {
        auVar22 = vpunpcklwd_avx2(auVar18,auVar19);
        auVar18 = vpunpckhwd_avx2(auVar18,auVar19);
        pauVar12 = (undefined1 (*) [32])(im_block + 0x18);
        do {
          auVar28 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar12[-1] + 0x10),*pauVar12);
          auVar26 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar12[-1] + 0x10),*pauVar12);
          auVar19 = vpmaddwd_avx2(auVar22,(undefined1  [32])alVar30);
          auVar22 = vpmaddwd_avx2(auVar28,auVar31);
          local_4a0 = (__m256i)vpaddd_avx2(auVar22,auVar19);
          auVar18 = vpmaddwd_avx2(auVar18,(undefined1  [32])alVar30);
          auVar19 = vpmaddwd_avx2(auVar26,auVar31);
          local_480 = vpaddd_avx2(auVar19,auVar18);
          xy_y_round_store_8x2_avx2(&local_4a0,dst,(long)dst_stride);
          dst = dst + dst_stride * 2;
          pauVar12 = pauVar12 + 1;
          h = h + -2;
          auVar18 = auVar26;
          auVar22 = auVar28;
        } while (h != 0);
      }
    }
    else if (w == 4) {
      uVar8 = *(ulong *)(im_block + 8);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)(im_block + 4);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)im_block;
      auVar18._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar29;
      auVar18._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar21;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar8;
      auVar22._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar21;
      auVar22._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
      auVar18 = vpunpcklwd_avx2(auVar18,auVar22);
      lVar10 = 0;
      auVar19._8_4_ = 0x400;
      auVar19._0_8_ = 0x40000000400;
      auVar19._12_4_ = 0x400;
      auVar19._16_4_ = 0x400;
      auVar19._20_4_ = 0x400;
      auVar19._24_4_ = 0x400;
      auVar19._28_4_ = 0x400;
      do {
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)(im_block + lVar10 * 4 + 0xc);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = uVar8;
        auVar28._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar15;
        auVar28._16_16_ = ZEXT116(1) * auVar25;
        uVar8 = *(ulong *)(im_block + lVar10 * 4 + 0x10);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar8;
        auVar26._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar25;
        auVar26._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar16;
        auVar22 = vpmaddwd_avx2(auVar18,(undefined1  [32])alVar30);
        auVar18 = vpunpcklwd_avx2(auVar28,auVar26);
        auVar22 = vpaddd_avx2(auVar22,auVar19);
        auVar26 = vpmaddwd_avx2(auVar18,auVar31);
        auVar22 = vpaddd_avx2(auVar22,auVar26);
        auVar22 = vpsrad_avx2(auVar22,0xb);
        auVar22 = vpackssdw_avx2(auVar22,auVar22);
        auVar22 = vpackuswb_avx2(auVar22,auVar22);
        *(int *)dst = auVar22._0_4_;
        *(int *)(dst + dst_stride) = auVar22._16_4_;
        dst = dst + dst_stride * 2;
        lVar10 = lVar10 + 2;
      } while (h != (int)lVar10);
    }
    else {
      lVar10 = (long)w;
      lVar11 = 0;
      piVar9 = im_block;
      do {
        palVar1 = (__m256i *)(im_block + lVar11);
        dst_00 = dst + lVar11;
        local_4a0 = *palVar1;
        local_480 = *(undefined1 (*) [32])((long)*palVar1 + lVar10 * 2);
        local_460 = *(undefined1 (*) [32])((long)*palVar1 + lVar10 * 4);
        local_1e0[0] = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_4a0,local_480);
        local_1a0 = vpunpckhwd_avx2((undefined1  [32])local_4a0,local_480);
        local_2e0[0] = (__m256i)vpunpcklwd_avx2(local_480,local_460);
        local_2a0 = vpunpckhwd_avx2(local_480,local_460);
        local_420 = palVar1[1];
        local_400 = *(undefined1 (*) [32])((long)palVar1[1] + lVar10 * 2);
        local_3e0 = *(undefined1 (*) [32])((long)palVar1[1] + lVar10 * 4);
        local_160[0] = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_420,local_400);
        local_120 = vpunpckhwd_avx2((undefined1  [32])local_420,local_400);
        local_260[0] = (__m256i)vpunpcklwd_avx2(local_400,local_3e0);
        local_220 = vpunpckhwd_avx2(local_400,local_3e0);
        src = piVar9;
        iVar13 = h;
        do {
          xy_y_convolve_4tap_32x2_avx2
                    (src,lVar10,&local_4a0,local_1e0,local_2e0,&local_3a0,(__m256i *)local_e0);
          xy_y_convolve_4tap_32x2_avx2
                    (src + 0x10,lVar10,&local_420,local_160,local_260,&local_3a0,
                     (__m256i *)local_360);
          xy_y_round_store_32_avx2((__m256i *)local_e0,(__m256i *)local_360,dst_00);
          xy_y_round_store_32_avx2((__m256i *)local_a0,(__m256i *)local_320,dst_00 + dst_stride);
          dst_00 = dst_00 + dst_stride * 2;
          src = src + w * 2;
          iVar13 = iVar13 + -2;
        } while (iVar13 != 0);
        lVar11 = lVar11 + 0x20;
        piVar9 = piVar9 + 0x20;
      } while (lVar11 < lVar10);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_4tap_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y = h;

  if (w == 2) {
    __m128i coeffs_128[2], s_32[4], ss_128[2];

    prepare_coeffs_4tap_sse2(filter_params_y, subpel_y_q4, coeffs_128);

    s_32[0] = _mm_cvtsi32_si128(*(int32_t *)(im + 0 * 2));
    s_32[1] = _mm_cvtsi32_si128(*(int32_t *)(im + 1 * 2));
    s_32[2] = _mm_cvtsi32_si128(*(int32_t *)(im + 2 * 2));

    const __m128i src01 = _mm_unpacklo_epi32(s_32[0], s_32[1]);
    const __m128i src12 = _mm_unpacklo_epi32(s_32[1], s_32[2]);

    ss_128[0] = _mm_unpacklo_epi16(src01, src12);

    do {
      const __m128i res =
          xy_y_convolve_4tap_2x2_sse2(im, s_32, ss_128, coeffs_128);
      xy_y_round_store_2x2_sse2(res, dst, dst_stride);
      im += 2 * 2;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else {
    __m256i coeffs_256[2];

    prepare_coeffs_4tap_avx2(filter_params_y, subpel_y_q4, coeffs_256);

    if (w == 4) {
      __m128i s_64[4];
      __m256i s_256[2], ss_256[2];

      s_64[0] = _mm_loadl_epi64((__m128i *)(im + 0 * 4));
      s_64[1] = _mm_loadl_epi64((__m128i *)(im + 1 * 4));
      s_64[2] = _mm_loadl_epi64((__m128i *)(im + 2 * 4));

      // Load lines a and b. Line a to lower 128, line b to upper 128
      s_256[0] = _mm256_setr_m128i(s_64[0], s_64[1]);
      s_256[1] = _mm256_setr_m128i(s_64[1], s_64[2]);

      ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);

      do {
        const __m256i res =
            xy_y_convolve_4tap_4x2_avx2(im, s_64, ss_256, coeffs_256);
        xy_y_round_store_4x2_avx2(res, dst, dst_stride);
        im += 2 * 4;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 8) {
      __m256i s_256[4], r[2];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 8));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 8));

      if (subpel_y_q4 != 8) {
        __m256i ss_256[4];

        ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
        ss_256[2] = _mm256_unpackhi_epi16(s_256[0], s_256[1]);

        do {
          xy_y_convolve_4tap_8x2_avx2(im, ss_256, coeffs_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_4tap_8x2_half_pel_avx2(im, coeffs_256, s_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else if (w == 16) {
      __m256i s_256[5];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));
      s_256[2] = _mm256_loadu_si256((__m256i *)(im + 2 * 16));

      if (subpel_y_q4 != 8) {
        __m256i ss_256[4], tt_256[4], r[4];

        ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
        ss_256[2] = _mm256_unpackhi_epi16(s_256[0], s_256[1]);

        tt_256[0] = _mm256_unpacklo_epi16(s_256[1], s_256[2]);
        tt_256[2] = _mm256_unpackhi_epi16(s_256[1], s_256[2]);

        do {
          xy_y_convolve_4tap_16x2_avx2(im, s_256, ss_256, tt_256, coeffs_256,
                                       r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);
          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        __m256i r[4];

        do {
          xy_y_convolve_4tap_16x2_half_pelavx2(im, s_256, coeffs_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);
          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else {
      /*It's a special condition for OBMC. A/c  to Av1 spec 4-tap won't
      support for width(w)>16, but for OBMC while predicting above block
      it reduces size block to Wx(h/2), for example, if above block size
      is 32x8, we get block size as 32x4 for OBMC.*/
      int32_t x = 0;

      assert(!(w % 32));

      __m256i s_256[2][4], ss_256[2][4], tt_256[2][4], r0[4], r1[4];
      do {
        const int16_t *s = im + x;
        uint8_t *d = dst + x;

        loadu_unpack_16bit_3rows_avx2(s, w, s_256[0], ss_256[0], tt_256[0]);
        loadu_unpack_16bit_3rows_avx2(s + 16, w, s_256[1], ss_256[1],
                                      tt_256[1]);

        y = h;
        do {
          xy_y_convolve_4tap_32x2_avx2(s, w, s_256[0], ss_256[0], tt_256[0],
                                       coeffs_256, r0);
          xy_y_convolve_4tap_32x2_avx2(s + 16, w, s_256[1], ss_256[1],
                                       tt_256[1], coeffs_256, r1);

          xy_y_round_store_32_avx2(r0 + 0, r1 + 0, d);
          xy_y_round_store_32_avx2(r0 + 2, r1 + 2, d + dst_stride);

          s += 2 * w;
          d += 2 * dst_stride;
          y -= 2;
        } while (y);

        x += 32;
      } while (x < w);
    }
  }
}